

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

void parse_tmat_senmap(mdef_t *m,char *line,long off,int p)

{
  int iVar1;
  char local_438 [8];
  char word [1024];
  char *lp;
  int32 s;
  int32 n;
  int32 wlen;
  int p_local;
  long off_local;
  char *line_local;
  mdef_t *m_local;
  
  word._1016_8_ = line + off;
  n = p;
  _wlen = off;
  off_local = (long)line;
  line_local = (char *)m;
  iVar1 = __isoc99_sscanf(word._1016_8_,"%d%n",(long)&lp + 4,&s);
  if ((iVar1 != 1) || ((int)lp._4_4_ < 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            0x118,"Missing or bad transition matrix id: %s\n",off_local);
    exit(1);
  }
  *(uint *)(*(long *)(line_local + 0x28) + (long)n * 0x14 + 4) = lp._4_4_;
  if (*(int *)(line_local + 0x14) <= (int)lp._4_4_) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            0x11c,"tmat-id(%d) > #tmat in header(%d): %s\n",(ulong)lp._4_4_,
            (ulong)*(uint *)(line_local + 0x14),off_local);
    exit(1);
  }
  word._1016_8_ = word._1016_8_ + (long)s;
  lp._4_4_ = 0;
  while( true ) {
    if (*(int *)(line_local + 8) <= (int)lp._4_4_) {
      iVar1 = __isoc99_sscanf(word._1016_8_,"%s%n",local_438,&s);
      if (iVar1 == 1) {
        iVar1 = strcmp(local_438,"N");
        if (iVar1 == 0) {
          word._1016_8_ = word._1016_8_ + (long)s;
          iVar1 = __isoc99_sscanf(word._1016_8_,"%s%n",local_438,&s);
          if (iVar1 == 1) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0x137,"Non-empty beyond non-emitting final state: %s\n",off_local);
            exit(1);
          }
          return;
        }
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x132,"Missing non-emitting state spec: %s\n",off_local);
      exit(1);
    }
    iVar1 = __isoc99_sscanf(word._1016_8_,"%d%n",&lp,&s);
    if ((iVar1 != 1) || ((int)(uint)lp < 0)) break;
    if ((n < *(int *)line_local) && (*(int *)(line_local + 0xc) <= (int)(uint)lp)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x127,"CI-senone-id(%d) > #CI-senones(%d): %s\n",(ulong)(uint)lp,
              (ulong)*(uint *)(line_local + 0xc),off_local);
      exit(1);
    }
    if (*(int *)(line_local + 0x10) <= (int)(uint)lp) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x12a,"Senone-id(%d) > #senones(%d): %s\n",(ulong)(uint)lp,
              (ulong)*(uint *)(line_local + 0x10),off_local);
      exit(1);
    }
    *(short *)(*(long *)(*(long *)(line_local + 0x30) + (long)n * 8) + (long)(int)lp._4_4_ * 2) =
         (short)(uint)lp;
    word._1016_8_ = word._1016_8_ + (long)s;
    lp._4_4_ = lp._4_4_ + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
          0x123,"Missing or bad state[%d]->senone mapping: %s\n",(ulong)lp._4_4_,off_local);
  exit(1);
}

Assistant:

static void
parse_tmat_senmap(mdef_t * m, char *line, long off, int p)
{
    int32 wlen, n, s;
    char *lp;
    __BIGSTACKVARIABLE__ char word[1024];

    lp = line + off;

    /* Read transition matrix id */
    if ((sscanf(lp, "%d%n", &n, &wlen) != 1) || (n < 0))
        E_FATAL("Missing or bad transition matrix id: %s\n", line);
    m->phone[p].tmat = n;
    if (m->n_tmat <= n)
        E_FATAL("tmat-id(%d) > #tmat in header(%d): %s\n", n, m->n_tmat,
                line);
    lp += wlen;

    /* Read senone mappings for each emitting state */
    for (n = 0; n < m->n_emit_state; n++) {
        if ((sscanf(lp, "%d%n", &s, &wlen) != 1) || (s < 0))
            E_FATAL("Missing or bad state[%d]->senone mapping: %s\n", n,
                    line);

        if ((p < m->n_ciphone) && (m->n_ci_sen <= s))
            E_FATAL("CI-senone-id(%d) > #CI-senones(%d): %s\n", s,
                    m->n_ci_sen, line);
        if (m->n_sen <= s)
            E_FATAL("Senone-id(%d) > #senones(%d): %s\n", s, m->n_sen,
                    line);

        m->sseq[p][n] = s;
        lp += wlen;
    }

    /* Check for the last non-emitting state N */
    if ((sscanf(lp, "%s%n", word, &wlen) != 1) || (strcmp(word, "N") != 0))
        E_FATAL("Missing non-emitting state spec: %s\n", line);
    lp += wlen;

    /* Check for end of line */
    if (sscanf(lp, "%s%n", word, &wlen) == 1)
        E_FATAL("Non-empty beyond non-emitting final state: %s\n", line);
}